

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O3

void vstprintf_s(tchar_t *Out,size_t OutLen,tchar_t *Mask,__va_list_tag *Arg)

{
  long lVar1;
  byte *pbVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  byte *pbVar7;
  undefined8 *puVar8;
  double *pdVar9;
  undefined4 *puVar10;
  ulong uVar11;
  size_t sVar12;
  long *plVar13;
  int iVar14;
  int *piVar15;
  ulong *puVar16;
  ulong uVar17;
  byte bVar18;
  byte bVar19;
  char cVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  int iVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  bool bVar36;
  bool bVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  byte *local_50;
  
  local_50 = (byte *)Out;
  if (1 < OutLen) {
    do {
      bVar19 = *Mask;
      if (bVar19 != 0x25) {
        if (bVar19 != 0) {
          Mask = (tchar_t *)((byte *)Mask + 1);
          *local_50 = bVar19;
LAB_001084a2:
          local_50 = local_50 + 1;
          OutLen = OutLen - 1;
          goto LAB_00109545;
        }
        goto LAB_0010956c;
      }
      bVar19 = ((byte *)Mask)[1];
      if (bVar19 == 0x25) {
        Mask = (tchar_t *)((byte *)Mask + 2);
        *local_50 = 0x25;
        goto LAB_001084a2;
      }
      pbVar7 = (byte *)Mask + 2;
      if (bVar19 != 0x2d) {
        pbVar7 = (byte *)Mask + 1;
      }
      uVar24 = (ulong)(((byte *)Mask)[2 - (ulong)(bVar19 != 0x2d)] == 0x30);
      bVar18 = pbVar7[uVar24];
      iVar14 = (int)(char)bVar18;
      pbVar7 = pbVar7 + uVar24;
      uVar23 = 0xffffffffffffffff;
      if (0xfffffff5 < iVar14 - 0x3aU) {
        uVar23 = 0;
        do {
          uVar23 = ((long)(char)iVar14 + uVar23 * 10) - 0x30;
          bVar18 = pbVar7[1];
          iVar14 = (int)(char)bVar18;
          pbVar7 = pbVar7 + 1;
        } while (0xfffffff5 < iVar14 - 0x3aU);
      }
      iVar14 = 0;
      if (bVar18 == 0x2e) {
        bVar18 = pbVar7[1];
        pbVar7 = pbVar7 + 1;
        if (0xfffffff5 < (int)(char)bVar18 - 0x3aU) {
          uVar21 = (int)(char)bVar18 - 0x30;
          iVar14 = 0;
          do {
            iVar14 = uVar21 + iVar14 * 10;
            bVar18 = pbVar7[1];
            pbVar7 = pbVar7 + 1;
            uVar21 = (int)(char)bVar18 - 0x30;
          } while (uVar21 < 10);
        }
      }
      if (bVar18 == 0x2a) {
        uVar21 = Arg->gp_offset;
        if ((ulong)uVar21 < 0x29) {
          piVar15 = (int *)((ulong)uVar21 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar21 + 8;
        }
        else {
          piVar15 = (int *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = piVar15 + 2;
        }
        pbVar7 = pbVar7 + 1;
        uVar23 = (ulong)*piVar15;
      }
      bVar37 = false;
      for (; bVar18 = *pbVar7, bVar18 == 0x6c; pbVar7 = pbVar7 + 1) {
        bVar37 = true;
      }
      if ((bVar18 == 0x49) && (bVar18 = 0x49, pbVar7[1] == 0x36)) {
        if (pbVar7[2] == 0x34) {
          bVar37 = true;
        }
        lVar31 = (ulong)(pbVar7[2] == 0x34) * 3;
        bVar18 = pbVar7[lVar31];
        pbVar7 = pbVar7 + lVar31;
      }
      bVar36 = bVar18 == 0x75;
      pbVar2 = pbVar7 + bVar36;
      bVar18 = pbVar7[bVar36];
      if (bVar18 < 0x58) {
        if (bVar18 == 0x45) goto switchD_00108604_caseD_65;
        if (bVar18 == 0x47) goto switchD_00108604_caseD_66;
        if (bVar18 == 0x53) {
          uVar21 = Arg->gp_offset;
          if ((ulong)uVar21 < 0x29) {
            puVar8 = (undefined8 *)((ulong)uVar21 + (long)Arg->reg_save_area);
            Arg->gp_offset = uVar21 + 8;
          }
          else {
            puVar8 = (undefined8 *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = puVar8 + 1;
          }
          pcVar4 = (char *)*puVar8;
          sVar12 = strlen(pcVar4);
          uVar24 = OutLen - 1;
          if (uVar24 <= sVar12) {
            sVar12 = uVar24;
          }
          uVar11 = uVar23 - sVar12;
          uVar33 = uVar11;
          if (((bVar19 != 0x2d) && (uVar33 = uVar11 - 1, 0 < (long)uVar11)) && (1 < OutLen)) {
            uVar11 = OutLen - 2;
            if (uVar33 < OutLen - 2) {
              uVar11 = uVar33;
            }
            memset(local_50,0x20,uVar11 + 1);
            local_50 = local_50 + uVar11 + 1;
            OutLen = uVar24 - uVar11;
            uVar33 = (uVar23 - (uVar11 + sVar12)) - 2;
          }
          if ((sVar12 != 0) && (1 < OutLen)) {
            lVar31 = 0;
            do {
              bVar19 = pcVar4[lVar31];
              if (bVar19 == 0) {
                local_50 = local_50 + lVar31;
                goto LAB_00109325;
              }
              local_50[lVar31] = bVar19;
              OutLen = OutLen - 1;
              lVar34 = lVar31 + 1;
            } while ((sVar12 - 1 != lVar31) && (lVar31 = lVar34, 1 < OutLen));
            local_50 = local_50 + lVar34;
          }
LAB_00109325:
          if ((0 < (long)uVar33) && (1 < OutLen)) {
            uVar23 = uVar33 - 1;
            if (OutLen - 2 < uVar33 - 1) {
              uVar23 = OutLen - 2;
            }
            memset(local_50,0x20,uVar23 + 1);
            OutLen = ~uVar23 + OutLen;
            pbVar7 = local_50 + uVar23 + 1;
            goto LAB_00109538;
          }
        }
        goto switchD_00108604_caseD_68;
      }
      pbVar7 = local_50;
      switch(bVar18) {
      case 99:
        uVar24 = OutLen;
        if (bVar19 == 0x2d) {
          uVar33 = uVar23 - 1;
        }
        else {
          uVar33 = uVar23 - 2;
          if ((1 < (long)uVar23) && (1 < OutLen)) {
            uVar24 = uVar33;
            if (OutLen - 2 < uVar33) {
              uVar24 = OutLen - 2;
            }
            memset(local_50,0x20,uVar24 + 1);
            local_50 = local_50 + uVar24 + 1;
            uVar33 = (uVar23 - uVar24) - 3;
            uVar24 = OutLen + ~uVar24;
          }
        }
        uVar21 = Arg->gp_offset;
        if ((ulong)uVar21 < 0x29) {
          pbVar7 = (byte *)((ulong)uVar21 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar21 + 8;
        }
        else {
          pbVar7 = (byte *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = pbVar7 + 8;
        }
        *local_50 = *pbVar7;
        pbVar7 = local_50 + 1;
        OutLen = uVar24 - 1;
        if ((0 < (long)uVar33) && (1 < OutLen)) {
          uVar23 = uVar33 - 1;
          if (uVar24 - 3 < uVar33 - 1) {
            uVar23 = uVar24 - 3;
          }
          memset(pbVar7,0x20,uVar23 + 1);
          local_50 = local_50 + uVar23 + 2;
          OutLen = (uVar24 - uVar23) - 2;
          goto switchD_00108604_caseD_68;
        }
        break;
      case 100:
      case 0x69:
      case 0x78:
switchD_00108604_caseD_64:
        uVar21 = Arg->gp_offset;
        if (bVar37) {
          if (uVar21 < 0x29) {
            puVar16 = (ulong *)((long)Arg->reg_save_area + (ulong)uVar21);
            Arg->gp_offset = uVar21 + 8;
          }
          else {
            puVar16 = (ulong *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = puVar16 + 1;
          }
          uVar33 = *puVar16;
        }
        else {
          if (uVar21 < 0x29) {
            piVar15 = (int *)((ulong)uVar21 + (long)Arg->reg_save_area);
            Arg->gp_offset = uVar21 + 8;
          }
          else {
            piVar15 = (int *)Arg->overflow_arg_area;
            Arg->overflow_arg_area = piVar15 + 2;
          }
          uVar33 = (ulong)*piVar15;
        }
        bVar37 = (*pbVar2 | 0x20) != 0x78;
        if (bVar37) {
          uVar11 = 10;
          uVar17 = 100000000000;
        }
        else {
          uVar17 = 0x10000000;
          uVar11 = 0x10;
        }
        uVar28 = (ulong)((long)uVar33 < 0 && (bVar37 && !bVar36));
        uVar25 = -uVar33;
        if ((long)uVar33 >= 0 || (!bVar37 || bVar36)) {
          uVar25 = uVar33;
        }
        uVar33 = 1;
        if (1 < (long)(uVar23 - uVar28)) {
          lVar31 = -uVar28 + uVar23 + -2;
          auVar42._8_4_ = (int)lVar31;
          auVar42._0_8_ = lVar31;
          auVar42._12_4_ = (int)((ulong)lVar31 >> 0x20);
          lVar31 = 4;
          auVar48 = _DAT_0010b4e0;
          do {
            auVar41 = auVar48;
            auVar48._0_4_ = (undefined4)(auVar41._0_4_ * uVar11);
            auVar44._8_4_ = (undefined4)((auVar41._8_8_ & 0xffffffff) * uVar11);
            auVar44._4_4_ = auVar44._8_4_;
            auVar44._0_4_ = auVar48._0_4_;
            uVar21 = auVar41._4_4_;
            auVar45._4_4_ = uVar21;
            auVar45._0_4_ = uVar21;
            auVar45._8_4_ = auVar41._12_4_;
            auVar45._12_4_ = auVar41._12_4_;
            auVar44._12_4_ = (int)((auVar45._8_8_ & 0xffffffff) * uVar11);
            auVar48._8_8_ = auVar44._8_8_;
            auVar48._4_4_ = (int)(uVar21 * uVar11);
            lVar34 = (uVar23 + -uVar28 + 2 & 0xfffffffffffffffc) + lVar31;
            lVar31 = lVar31 + -4;
          } while (lVar34 != 8);
          lVar31 = -lVar31;
          auVar43._8_4_ = (int)lVar31;
          auVar43._0_8_ = lVar31;
          auVar43._12_4_ = (int)((ulong)lVar31 >> 0x20);
          auVar42 = auVar42 ^ _DAT_0010b510;
          auVar44 = (auVar43 | _DAT_0010b500) ^ _DAT_0010b510;
          iVar14 = auVar42._4_4_;
          iVar22 = auVar42._12_4_;
          auVar45 = (auVar43 | _DAT_0010b4f0) ^ _DAT_0010b510;
          auVar46._0_4_ = -(uint)(auVar45._4_4_ == iVar14 && auVar42._0_4_ < auVar45._0_4_);
          auVar46._4_4_ = -(uint)(auVar45._12_4_ == iVar22 && auVar42._8_4_ < auVar45._8_4_);
          auVar46._8_4_ = -(uint)(auVar42._0_4_ < auVar44._0_4_ && auVar44._4_4_ == iVar14);
          auVar46._12_4_ = -(uint)(auVar42._8_4_ < auVar44._8_4_ && auVar44._12_4_ == iVar22);
          auVar47._4_4_ = -(uint)(iVar22 < auVar45._12_4_);
          auVar47._0_4_ = -(uint)(iVar14 < auVar45._4_4_);
          auVar47._8_4_ = -(uint)(iVar14 < auVar44._4_4_);
          auVar47._12_4_ = -(uint)(iVar22 < auVar44._12_4_);
          auVar48 = ~(auVar47 | auVar46) & auVar48 | auVar41 & (auVar47 | auVar46);
          uVar33 = ((ulong)auVar48._8_4_ * (ulong)auVar48._0_4_ & 0xffffffff) *
                   ((ulong)auVar48._4_4_ * (ulong)auVar48._12_4_ & 0xffffffff) & 0xffffffff;
        }
        if ((long)uVar33 < (long)uVar25) {
          uVar33 = uVar25;
        }
        if (uVar33 < uVar17) {
          do {
            uVar17 = uVar17 / uVar11;
          } while ((long)uVar33 < (long)uVar17);
          if (uVar17 == 0) break;
        }
        do {
          uVar23 = (long)uVar25 / (long)uVar17;
          uVar21 = (uint)uVar23;
          if ((OutLen < 2) || (uVar28 == 0)) {
LAB_00108c0d:
            if (1 < OutLen) {
              if (((uVar17 != 1) && (uVar21 == 0)) && (uVar24 == 0)) goto LAB_00108c28;
              bVar19 = (byte)uVar23;
              if (uVar21 < 10) {
                bVar19 = bVar19 | 0x30;
              }
              else if (*pbVar2 == 0x58) {
                bVar19 = bVar19 + 0x37;
              }
              else {
                bVar19 = bVar19 + 0x57;
              }
              uVar24 = 1;
              goto LAB_00108c59;
            }
            OutLen = 1;
          }
          else {
            if ((uVar17 == 1) || ((uVar24 != 0 || (uVar21 != 0)))) {
              *local_50 = 0x2d;
              local_50 = local_50 + 1;
              OutLen = OutLen - 1;
              uVar28 = 0;
              goto LAB_00108c0d;
            }
LAB_00108c28:
            bVar19 = 0x20;
            uVar24 = 0;
LAB_00108c59:
            *local_50 = bVar19;
            local_50 = local_50 + 1;
            OutLen = OutLen - 1;
          }
          uVar25 = uVar25 - (uVar23 & 0xffffffff) * uVar17;
          uVar17 = uVar17 / uVar11;
          pbVar7 = local_50;
        } while (uVar17 != 0);
        break;
      case 0x65:
switchD_00108604_caseD_65:
        uVar21 = Arg->fp_offset;
        if ((ulong)uVar21 < 0xa1) {
          pdVar9 = (double *)((ulong)uVar21 + (long)Arg->reg_save_area);
          Arg->fp_offset = uVar21 + 0x10;
        }
        else {
          pdVar9 = (double *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = pdVar9 + 1;
        }
        dVar38 = *pdVar9;
        if (dVar38 < 0.0) {
          *local_50 = 0x2d;
          local_50 = local_50 + 1;
          OutLen = OutLen - 1;
          dVar38 = -dVar38;
        }
        if (1.0 <= dVar38) {
          iVar14 = -1;
          dVar39 = 1.0;
          if (1.0 < dVar38) {
            dVar39 = 1.0;
            do {
              dVar39 = dVar39 * 10.0;
              iVar14 = iVar14 + 1;
            } while (1.0 < dVar38 * dVar39);
          }
          dVar38 = dVar38 * 10.0;
        }
        else {
          iVar14 = 0;
          if (1.0 <= dVar38) {
            dVar39 = 1.0;
          }
          else {
            iVar14 = 0;
            dVar39 = 1.0;
            do {
              dVar39 = dVar39 * 10.0;
              iVar14 = iVar14 + -1;
            } while (dVar38 * dVar39 < 1.0);
          }
        }
        if (4 < OutLen) {
          dVar39 = dVar39 * dVar38;
          dVar40 = (dVar39 - (double)(int)dVar39) * 10.0;
          dVar38 = dVar40 + 1.0;
          if (dVar40 - (double)(int)dVar40 <= 0.5) {
            dVar38 = dVar40;
          }
          *local_50 = (char)(int)dVar39 + 0x30;
          local_50[1] = 0x2e;
          local_50[2] = (char)(int)dVar38 + 0x30;
          local_50[3] = *pbVar2;
          local_50 = local_50 + 4;
          OutLen = OutLen - 4;
        }
        if (iVar14 < 0 && 1 < OutLen) {
          *local_50 = 0x2d;
          local_50 = local_50 + 1;
          OutLen = OutLen - 1;
          iVar14 = -iVar14;
        }
        if (3 < OutLen) {
          cVar5 = (char)(iVar14 / 100);
          *local_50 = cVar5 + 0x30;
          cVar5 = (char)iVar14 + cVar5 * -100;
          cVar20 = (char)((uint)(int)(short)(cVar5 * 0x67) >> 10) - (cVar5 >> 7);
          local_50[1] = cVar20 + 0x30;
          local_50[2] = cVar5 + cVar20 * -10 + 0x30;
          local_50 = local_50 + 3;
          OutLen = OutLen - 3;
        }
        goto switchD_00108604_caseD_68;
      case 0x66:
      case 0x67:
switchD_00108604_caseD_66:
        uVar21 = Arg->fp_offset;
        if ((ulong)uVar21 < 0xa1) {
          pdVar9 = (double *)((ulong)uVar21 + (long)Arg->reg_save_area);
          Arg->fp_offset = uVar21 + 0x10;
        }
        else {
          pdVar9 = (double *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = pdVar9 + 1;
        }
        dVar38 = *pdVar9;
        dVar39 = -dVar38;
        if (-dVar38 <= dVar38) {
          dVar39 = dVar38;
        }
        if (-1 < (long)uVar23) {
          lVar31 = (long)dVar39;
          if (lVar31 < 1) {
            uVar21 = (uint)(dVar38 < 0.0);
            iVar22 = ~uVar21 + (int)uVar23;
            iVar6 = 0;
LAB_0010891e:
            iVar27 = 0;
            lVar31 = lVar31 + 1;
            do {
              iVar27 = iVar27 + 1;
              bVar37 = lVar31 < 0x147ae147ae147ae;
              lVar31 = lVar31 * 10;
            } while (bVar37);
          }
          else {
            iVar6 = 0;
            uVar24 = 1;
            do {
              iVar6 = iVar6 + 1;
              if (0x147ae147ae147ad < uVar24) break;
              uVar24 = uVar24 * 10;
            } while ((long)uVar24 <= lVar31);
            uVar21 = (uint)(dVar38 < 0.0);
            iVar22 = (~uVar21 + (int)uVar23) - iVar6;
            iVar27 = 0;
            if (lVar31 < 0xccccccccccccccb) goto LAB_0010891e;
          }
          if (iVar27 < iVar22) {
            iVar22 = iVar27;
          }
          if (iVar22 < 1) {
            iVar27 = 0;
          }
          else {
            lVar34 = (long)(int)dVar39;
            iVar27 = 0;
            lVar31 = 1;
            iVar32 = 1;
            do {
              lVar31 = lVar31 * 10;
              uVar35 = (uint)((double)lVar31 * dVar39 - (double)(lVar34 * 10));
              lVar34 = lVar34 * 10 + (ulong)uVar35;
              if (uVar35 != 0) {
                iVar27 = iVar32;
              }
              bVar37 = iVar32 != iVar22;
              iVar32 = iVar32 + 1;
            } while (bVar37);
          }
          iVar22 = iVar27;
          if (iVar27 < iVar14) {
            iVar22 = iVar14;
          }
          if (iVar14 < 1) {
            iVar22 = iVar27;
          }
          iVar6 = (iVar6 + uVar21 + 1) - (uint)(iVar22 == 0);
          if ((long)uVar23 < (long)iVar6) {
            *local_50 = 0x65;
            OutLen = OutLen - 1;
            pbVar7 = local_50 + 1;
            break;
          }
          if (bVar19 != 0x2d) {
            for (; ((long)(iVar6 + iVar22) < (long)uVar23 && (1 < OutLen)); OutLen = OutLen - 1) {
              *local_50 = 0x20;
              local_50 = local_50 + 1;
              uVar23 = uVar23 - 1;
            }
          }
        }
        uVar21 = (uint)dVar39;
        uVar24 = OutLen;
        if ((dVar38 < 0.0) && (1 < OutLen)) {
          *local_50 = 0x2d;
          local_50 = local_50 + 1;
          uVar24 = OutLen - 1;
        }
        uVar33 = 1000000000;
        if (uVar21 < 1000000000) {
          uVar11 = 1000000000;
          do {
            uVar35 = (uint)uVar11;
            uVar33 = uVar11 / 10;
            uVar17 = uVar11 / 10;
            uVar11 = uVar33;
          } while (uVar21 + (uVar21 == 0) < (uint)uVar17);
          if (9 < uVar35) goto LAB_00108f8e;
        }
        else {
LAB_00108f8e:
          uVar11 = (ulong)uVar21;
          uVar17 = uVar24;
          do {
            uVar25 = uVar11 / uVar33;
            uVar11 = uVar11 % uVar33;
            uVar24 = 1;
            if (1 < uVar17) {
              if (((long)uVar23 < 0) || (bVar37 = uVar23 != 0, uVar23 = uVar23 - 1, bVar37)) {
                *local_50 = (char)uVar25 + 0x30;
                local_50 = local_50 + 1;
                uVar24 = uVar17 - 1;
              }
              else {
                uVar23 = 0xffffffffffffffff;
                uVar24 = uVar17;
              }
            }
            uVar35 = (uint)uVar33;
            uVar33 = uVar33 / 10;
            uVar17 = uVar24;
          } while (9 < uVar35);
        }
        lVar34 = (long)(int)uVar21;
        lVar31 = lVar34 + 1;
        iVar22 = 1;
        do {
          iVar6 = iVar22;
          bVar37 = lVar31 < 0x147ae147ae147ae;
          lVar31 = lVar31 * 10;
          iVar22 = iVar6 + 1;
        } while (bVar37);
        if (iVar14 == 0) {
          iVar14 = 0x1e;
        }
        if (iVar14 < 1) {
          uVar21 = 0;
        }
        else {
          if (iVar14 < iVar6) {
            iVar6 = iVar14;
          }
          iVar6 = iVar6 + 1;
          uVar21 = 0;
          lVar31 = 1;
          uVar35 = 1;
          lVar29 = lVar34;
          do {
            lVar31 = lVar31 * 10;
            uVar30 = (uint)((double)lVar31 * dVar39 - (double)(lVar29 * 10));
            if (uVar30 != 0) {
              uVar21 = uVar35;
            }
            lVar29 = lVar29 * 10 + (ulong)uVar30;
            iVar6 = iVar6 + -1;
            uVar35 = uVar35 + 1;
          } while (1 < iVar6);
        }
        uVar35 = 6;
        if (6 < uVar21) {
          uVar35 = uVar21;
        }
        if (uVar21 == 0) {
          uVar35 = 0;
        }
        if (*pbVar2 != 0x66) {
          uVar35 = uVar21;
        }
        OutLen = uVar24;
        pbVar7 = local_50;
        if ((uVar35 != 0) && (1 < uVar24)) {
          *local_50 = 0x2e;
          if (uVar24 - 1 < 2) {
            OutLen = uVar24 - 1;
            pbVar7 = local_50 + 1;
          }
          else {
            uVar33 = uVar23 - 2;
            uVar11 = uVar24 - 3;
            lVar26 = 1;
            lVar31 = 1;
            lVar29 = 0;
            do {
              lVar31 = lVar31 * 10;
              uVar21 = (uint)((double)lVar31 * dVar39 - (double)(lVar34 * 10));
              uVar17 = (ulong)uVar21;
              lVar34 = lVar34 * 10 + uVar17;
              if ((1 - uVar35 == (int)lVar29) && (5.0 <= (double)lVar31 * dVar39 - (double)lVar34))
              {
                uVar17 = (ulong)(uVar21 + 1);
              }
              local_50[lVar26] = (char)uVar17 + 0x30;
              lVar1 = lVar29 + -1;
              uVar33 = uVar33 - 1;
              uVar11 = uVar11 - 1;
              lVar26 = lVar26 + 1;
            } while ((1 - uVar35 != (int)lVar29) &&
                    (lVar3 = lVar29 + uVar24, lVar29 = lVar1, 1 < lVar3 - 2U));
            OutLen = (lVar1 + uVar24) - 1;
            pbVar7 = local_50 + (1 - lVar1);
            if ((2 < (long)(uVar23 + lVar1 + 1)) && (1 < OutLen)) {
              uVar17 = (lVar1 + uVar24) - 3;
              uVar23 = (uVar23 + lVar1) - 2;
              if (uVar17 < uVar23) {
                uVar23 = uVar17;
              }
              memset(local_50 + lVar26,0x20,uVar23 + 1);
              if (uVar33 < uVar11) {
                uVar11 = uVar33;
              }
              OutLen = ((uVar24 + lVar1) - uVar11) - 2;
              pbVar7 = local_50 + (uVar11 - lVar1) + 2;
            }
          }
        }
        break;
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x74:
      case 0x75:
      case 0x76:
      case 0x77:
        goto switchD_00108604_caseD_68;
      case 0x70:
        if (((8 < (long)uVar23) && (1 < OutLen)) && (uVar24 = uVar23, bVar19 != 0x2d)) {
          do {
            uVar23 = uVar24 - 1;
            *local_50 = 0x20;
            local_50 = local_50 + 1;
            OutLen = OutLen - 1;
            if (uVar24 < 10) break;
            uVar24 = uVar23;
          } while (1 < OutLen);
        }
        uVar21 = Arg->gp_offset;
        if ((ulong)uVar21 < 0x29) {
          plVar13 = (long *)((ulong)uVar21 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar21 + 8;
        }
        else {
          plVar13 = (long *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = plVar13 + 1;
        }
        if (1 < OutLen) {
          lVar31 = *plVar13;
          lVar34 = 0x1c;
          do {
            uVar21 = (uint)(lVar31 >> ((byte)lVar34 & 0x3f)) & 0xf;
            cVar5 = (char)uVar21;
            bVar19 = cVar5 + 0x37;
            if (uVar21 < 10) {
              bVar19 = cVar5 + 0x30;
            }
            *local_50 = bVar19;
            local_50 = local_50 + 1;
            OutLen = OutLen - 1;
          } while ((1 < OutLen) && (bVar37 = lVar34 != 0, lVar34 = lVar34 + -4, bVar37));
        }
        if (((long)uVar23 < 9) || (OutLen < 2)) goto switchD_00108604_caseD_68;
        uVar24 = uVar23 - 9;
        if (OutLen - 2 < uVar23 - 9) {
          uVar24 = OutLen - 2;
        }
        memset(local_50,0x20,uVar24 + 1);
        OutLen = ~uVar24 + OutLen;
        pbVar7 = local_50 + uVar24 + 1;
        break;
      case 0x72:
        uVar21 = Arg->gp_offset;
        if ((ulong)uVar21 < 0x29) {
          puVar10 = (undefined4 *)((ulong)uVar21 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar21 + 8;
        }
        else {
          puVar10 = (undefined4 *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = puVar10 + 2;
        }
        if (4 < OutLen) {
          *(undefined4 *)local_50 = *puVar10;
          lVar31 = 4;
          do {
            if (local_50[lVar31 + -1] != 0x5f) goto LAB_0010926d;
            lVar31 = lVar31 + -1;
          } while (lVar31 != 0);
          lVar31 = 0;
LAB_0010926d:
          local_50[lVar31] = 0;
          local_50 = local_50 + lVar31;
          OutLen = OutLen + lVar31;
        }
        goto switchD_00108604_caseD_68;
      case 0x73:
        uVar21 = Arg->gp_offset;
        if ((ulong)uVar21 < 0x29) {
          puVar8 = (undefined8 *)((ulong)uVar21 + (long)Arg->reg_save_area);
          Arg->gp_offset = uVar21 + 8;
        }
        else {
          puVar8 = (undefined8 *)Arg->overflow_arg_area;
          Arg->overflow_arg_area = puVar8 + 1;
        }
        pcVar4 = (char *)*puVar8;
        if (pcVar4 != (char *)0x0) {
          sVar12 = strlen(pcVar4);
          uVar24 = OutLen - 1;
          if (uVar24 <= sVar12) {
            sVar12 = uVar24;
          }
          uVar17 = uVar23 - sVar12;
          uVar33 = uVar17;
          uVar11 = OutLen;
          if (((bVar19 != 0x2d) && (uVar33 = uVar17 - 1, 0 < (long)uVar17)) && (1 < OutLen)) {
            uVar11 = OutLen - 2;
            if (uVar33 < OutLen - 2) {
              uVar11 = uVar33;
            }
            memset(local_50,0x20,uVar11 + 1);
            local_50 = local_50 + uVar11 + 1;
            uVar33 = (uVar23 - (uVar11 + sVar12)) - 2;
            uVar11 = uVar24 - uVar11;
          }
          memcpy(local_50,pcVar4,sVar12);
          pbVar7 = local_50 + sVar12;
          OutLen = uVar11 - sVar12;
          if ((0 < (long)uVar33) && (1 < OutLen)) {
            uVar24 = (uVar11 - sVar12) - 2;
            uVar23 = uVar33 - 1;
            if (uVar24 < uVar33 - 1) {
              uVar23 = uVar24;
            }
            memset(pbVar7,0x20,uVar23 + 1);
            OutLen = (~uVar23 + uVar11) - sVar12;
            pbVar7 = local_50 + sVar12 + uVar23 + 1;
          }
        }
        break;
      default:
        if (bVar18 == 0x58) goto switchD_00108604_caseD_64;
switchD_00108604_caseD_68:
        pbVar7 = local_50;
      }
LAB_00109538:
      local_50 = pbVar7;
      Mask = (tchar_t *)(pbVar2 + 1);
LAB_00109545:
      Out = (tchar_t *)local_50;
    } while (1 < OutLen);
  }
  local_50 = (byte *)Out;
  if (OutLen == 0) {
    __assert_fail("OutLen>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                  ,0x285,
                  "void vstprintf_s(tchar_t *, size_t, const tchar_t *, struct __va_list_tag *)");
  }
LAB_0010956c:
  *local_50 = 0;
  return;
}

Assistant:

void vstprintf_s(tchar_t* Out,size_t OutLen,const tchar_t* Mask,va_list Arg)
{
    int64_t vl;
	int vs;
    double dvs, _dvs;
	intptr_t Width,ptr;
	unsigned int v,w,q,w0;
	bool_t ZeroFill;
	bool_t Unsigned;
	bool_t Sign;
	bool_t AlignLeft;
    bool_t Long;
    int Decimals;
	const tchar_t *In;
	const char *InA;
	size_t n;
    int64_t lvs,_lvs,ww;

	while (OutLen>1 && *Mask)
	{
		switch (*Mask)
		{
		case '%':
			++Mask;

			if (*Mask == '%')
			{
				*(Out++) = *(Mask++);
				--OutLen;
				break;
			}

			AlignLeft = *Mask=='-';
			if (AlignLeft)
				++Mask;

			ZeroFill = *Mask=='0';
			if (ZeroFill)
				++Mask;

			Width = -1;
			if (IsDigit(*Mask))
			{
				Width = 0;
				for (;IsDigit(*Mask);++Mask)
					Width = Width*10 + (*Mask-'0');
			}

            Decimals = *Mask=='.';
			if (Decimals)
            {
				++Mask;
                Decimals = 0;
			    if (IsDigit(*Mask))
			    {
				    for (;IsDigit(*Mask);++Mask)
					    Decimals = Decimals*10 + (*Mask-'0');
			    }
            }

            Long = 0;
            if (*Mask == '*')
			{
				++Mask;
				Width = va_arg(Arg,int);
			}

            while (*Mask == 'l')
            {
                Long=1;
				++Mask; // long
            }

            if (*Mask=='I' && *(Mask+1)=='6' && *(Mask+2)=='4')
            {
                Long=1;
				Mask += 3;
            }

			Unsigned = *Mask=='u';
			if (Unsigned)
				++Mask;

			switch (*Mask)
			{
			case 'd':
			case 'i':
			case 'X':
			case 'x':
                if (Long)
				    vl = va_arg(Arg,int64_t);
                else
				    vl = va_arg(Arg,int);

				if (*Mask=='x' || *Mask=='X')
				{
					Unsigned = 1;
					q = 16;
					ww = 0x10000000;
				}
				else
				{
					q = 10;
					ww = 100000000000;
				}

				Sign = vl<0 && !Unsigned;
				if (Sign)
				{
					vl=-vl;
					--Width;
				}

				w0 = 1;
				for (;Width>1;--Width)
					w0 *= q;

				v = vl;
				while (vl<ww && ww>w0)
					ww/=q;

				while (ww>0)
				{
					unsigned int i = (unsigned int)(vl/ww); // between 0 and q-1
					vl-=i*ww;
					if (OutLen>1 && Sign && (ww==1 || ZeroFill || i>0))
					{
						*(Out++) = '-';
						--OutLen;
						Sign = 0;
					}
					if (OutLen>1)
					{
						if (i==0 && !ZeroFill && ww!=1)
							i = ' ';
						else
						{
							ZeroFill = 1;
							if (i>=10)
							{
								if (*Mask == 'X')
									i += 'A'-10;
								else
									i += 'a'-10;
							}
							else
								i+='0';
						}
						*(Out++) = (tchar_t)i;
						--OutLen;
					}
					ww/=q;
				}

				break;

			case 'c':
				Width -= 1;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
				*(Out++) = (tchar_t)va_arg(Arg,int);
				--OutLen;
				while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;

			case 's':
				In = va_arg(Arg,const tchar_t*);
                if (In)
                {
				    n = MIN(tcslen(In),OutLen-1);
				    Width -= n;
				    if (!AlignLeft)
					    while (--Width>=0 && OutLen>1)
					    {
						    *Out++ = ' ';
						    --OutLen;
					    }
				    memcpy(Out,In,n*sizeof(tchar_t));
				    Out += n;
				    OutLen -= n;
				    while (--Width>=0 && OutLen>1)
				    {
					    *Out++ = ' ';
					    --OutLen;
				    }
                }
				break;
			case 'S':
				InA = va_arg(Arg,const char*);
				n = MIN(strlen(InA),OutLen-1);
				Width -= n;
				if (!AlignLeft)
					while (--Width>=0 && OutLen>1)
					{
						*Out++ = ' ';
						--OutLen;
					}
                for (;n>0 && OutLen>1 && *InA;++InA,++Out,--OutLen,--n)
                    *Out = *InA;
    			while (--Width>=0 && OutLen>1)
				{
					*Out++ = ' ';
					--OutLen;
				}
				break;
            case 'g':
            case 'G':
            case 'f':
                dvs = va_arg(Arg,double);
                if (OutLen)
                {
			        Sign = dvs<0;
                    if (Sign && OutLen>1)
                        dvs = -dvs;

                    if (Width >= 0)
                    {
                        // count integer digits and decimal digits to adjust the alignment
                        int max_integer_digits = get_integers((int64_t)dvs);
                        int max_decimal_digits = get_decimals(Width - max_integer_digits - 1 - (Sign?1:0),(int64_t)dvs);
                        int max_total_chars;

                        vs = (int)dvs;
                        lvs = 1;
                        _lvs = vs;
                        w = w0 = 0; // decimals in use
                        while (max_decimal_digits-->0)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            w0++;
                            if (q)
                                w = w0;
                        }

                        if (Decimals>0)
                            max_decimal_digits = MAX(Decimals,(int)w);
                        else
                            max_decimal_digits = w;

                        max_total_chars = max_integer_digits + max_decimal_digits + (Sign?1:0) + (max_decimal_digits?1:0);

                        if (max_integer_digits + (Sign?1:0) + (max_decimal_digits?1:0) > Width)
                            goto do_exponent;

                        while (!AlignLeft && Width > max_total_chars && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --Width;
                            --OutLen;
                        }
                    }

                    // integer part
                    vs = (int)dvs;
			        v = vs;

                    if (Sign && dvs!=0.0 && OutLen > 1)
                    {
                        *Out++ = '-';
                        --OutLen;
                    }

				    w = 1000000000;
			        while (w>v && w>1)
				        w/=10;

                    // integer filling
                    while (w>0)
			        {
				        unsigned int i = v/w;
				        v-=i*w;
				        if (OutLen>1 && (Width<0 || Width-->0))
				        {
					        i+='0';
					        *(Out++) = (tchar_t)i;
					        --OutLen;
                        }
				        w/=10;
                    }

                    // decimal part
                    // dry run to count the number of necessary decimals
                    v = Decimals;
                    if (!Decimals)
                        Decimals=30;
                    Decimals = get_decimals(Decimals,vs);
                    lvs = 1;
                    _lvs = vs;
                    w = w0 = 0; // decimals in use
                    while (Decimals-->0)
                    {
                        lvs *= 10;
                        _lvs *= 10;
                        q = (int)(dvs * lvs - (double)_lvs);
                        _lvs += q;
                        w0++;
                        if (q)
                            w = w0;
                    }

                    if (*Mask==T('f') && w)
                        w = MAX(w,6);
                    if (w && OutLen>1)
                    {
                        *Out++ = T('.');
                        --OutLen;
                        --Width;

                        v -= w;

                        lvs = 1;
                        _lvs = vs;
                        while (w-->0 && OutLen>1)
                        {
                            lvs *= 10;
                            _lvs *= 10;
                            q = (int)(dvs * lvs - (double)_lvs);
                            _lvs += q;
                            if (w==0) // last one, do some rounding
                            {
                                if ((dvs * lvs - (double)_lvs) >= 5)
                                    q++;
                            }
                            *Out++ = (tchar_t)(q + '0');
                            --OutLen;
                            --Width;
                        }
                        while (Width-- > 0 && OutLen > 1)
                        {
                            *Out++ = ' ';
                            --OutLen;
                        }
                    }
                    break;
do_exponent:
                    // TODO
                    *Out++ = T('e');
                    OutLen--;
                }
                break;
            case 'e':
            case 'E':
                dvs = va_arg(Arg,double);
				Sign = dvs<0;
                if (Sign && OutLen>1)
                {
                    *Out++ = '-';
                    OutLen--;
                    dvs = -dvs;
                }
                vs = 0; // exponent
                _dvs = 1.0; // factor
                if (dvs >= 1.0)
                {
                    while (dvs*_dvs > 1.0)
                    {
                        _dvs *= 10.0;
                        vs++;
                    }
                    dvs *= 10.0;
                    vs--;
                }
                else
                {
                    while (dvs*_dvs < 1.0)
                    {
                        _dvs *= 10.0;
                        vs--;
                    }
                }

                dvs *= _dvs;
                if (OutLen > 4)
                {
                    *Out++ = (tchar_t)((int)dvs + T('0'));
                    *Out++ = T('.');
                    dvs -= (int)dvs;
                    dvs *= 10.0;
                    if (dvs - (int)dvs > 0.5)
                        *Out++ = (tchar_t)((int)(dvs+1) + T('0'));
                    else
                        *Out++ = (tchar_t)((int)(dvs) + T('0'));
                    *Out++ = *Mask;
                    OutLen -= 4;
                }
                if (OutLen > 1 && vs < 0)
                {
                    *Out++ = T('-');
                    OutLen--;
                    vs = -vs;
                }
                if (OutLen > 3)
                {
                    *Out++ = (tchar_t)((vs / 100) + T('0'));
                    vs %= 100;
                    *Out++ = (tchar_t)((vs / 10) + T('0'));
                    vs %= 10;
                    *Out++ = (tchar_t)(vs + T('0'));
                    OutLen -= 3;
                }
                break;
            case 'p':
                while (Width > 8 && !AlignLeft && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                ptr = va_arg(Arg,intptr_t);
                for (vs=28;OutLen>1 && vs>=0;vs-=4)
                {
                    q = (ptr>>vs) & 0x0F;
                    if (q<10)
                        *Out++ = (tchar_t)(q+T('0'));
                    else
                        *Out++ = (tchar_t)(q+T('A')-10);
                    OutLen--;
                }
                while (Width > 8 && OutLen > 1)
                {
                    Width--;
                    *Out++ = ' ';
                    OutLen--;
                }
                break;
            case 'r':
                {
                    fourcc_t FourCC = va_arg(Arg,fourcc_t);
                    if (OutLen > 4)
                    {
                        size_t Written = FourCCToString(Out,OutLen,FourCC);
                        Out+=Written;
                        OutLen+=Written;
                    }
                }
                break;
			}

			++Mask;
			break;

		default:
			*(Out++) = *(Mask++);
			--OutLen;
			break;
		}
	}

	assert(OutLen>0);
    if (OutLen>0)
        *Out=0;
}